

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcess.cpp
# Opt level: O1

string * __thiscall
MultiAgentDecisionProcess::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,MultiAgentDecisionProcess *this)

{
  pointer pcVar1;
  ostream *poVar2;
  stringstream ss;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Problem:",8);
  pcVar1 = (this->_m_name)._m_name._M_dataplus._M_p;
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,pcVar1,pcVar1 + (this->_m_name)._m_name._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)local_1d0,local_1c8)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"descr.:",7);
  pcVar1 = (this->_m_name)._m_description._M_dataplus._M_p;
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,pcVar1,pcVar1 + (this->_m_name)._m_description._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)local_1d0,local_1c8)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"nrAgents=",9);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"problem file=",0xd);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,(this->_m_problemFile)._M_dataplus._M_p,
                      (this->_m_problemFile)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"unixName=",9);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,(this->_m_unixName)._M_dataplus._M_p,
                      (this->_m_unixName)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

string MultiAgentDecisionProcess::SoftPrint() const
{
    stringstream ss;
    ss << "Problem:"<< _m_name.GetName()<< endl;
    ss << "descr.:"<< _m_name.GetDescription() << endl;
    ss << "nrAgents=" << _m_nrAgents << endl;
    ss << "problem file=" << _m_problemFile << endl;
    ss << "unixName=" << _m_unixName << endl;
    return(ss.str());
}